

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::XMLLoader::loadMaterial(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *pXVar1;
  MaterialNode *pMVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  MatteMaterial *this_00;
  undefined8 *in_RDX;
  XMLLoader *this_01;
  string *psVar11;
  Ref<embree::XML> parameters;
  Parms parms;
  string id;
  Ref<embree::SceneGraph::MaterialNode> material;
  string type;
  allocator local_d9;
  key_type local_d8;
  __atomic_base<unsigned_long> local_d0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  char local_b8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char local_80 [16];
  undefined1 local_70 [32];
  FILE *local_50;
  FILE local_40 [16];
  
  pXVar1 = (XML *)*in_RDX;
  local_c8._0_8_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"id","");
  XML::parm((string *)&local_90,pXVar1,(string *)&local_c8.field_1);
  if ((char *)local_c8._0_8_ != local_b8) {
    operator_delete((void *)local_c8._0_8_);
  }
  iVar5 = std::__cxx11::string::compare(local_90._M_local_buf);
  if (iVar5 != 0) {
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                    *)xml[10].ptr,(key_type *)&local_90);
    if ((_Rb_tree_header *)iVar6._M_node !=
        &(((_Rep_type *)&(xml[10].ptr)->super_RefCount)->_M_impl).super__Rb_tree_header) {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)xml[10].ptr,(key_type *)&local_90);
      pMVar2 = pmVar7->ptr;
      (this->path).filename._M_dataplus._M_p = (pointer)pMVar2;
      if (pMVar2 != (MaterialNode *)0x0) {
        (**(code **)((long)(pMVar2->super_Node).super_RefCount._vptr_RefCount + 0x10))();
      }
      goto LAB_001817cf;
    }
  }
  pXVar1 = (XML *)*in_RDX;
  local_c8._0_8_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"parameters","");
  bVar4 = XML::hasChild(pXVar1,(string *)&local_c8.field_1);
  if ((char *)local_c8._0_8_ != local_b8) {
    operator_delete((void *)local_c8._0_8_);
  }
  if (bVar4) {
    psVar11 = (string *)*in_RDX;
    local_c8._0_8_ = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"parameters","");
    XML::child((XML *)&local_d8,psVar11);
    if ((char *)local_c8._0_8_ != local_b8) {
      operator_delete((void *)local_c8._0_8_);
    }
    iVar8 = std::
            _Rb_tree<embree::Ref<embree::XML>,_std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
            ::find((_Rb_tree<embree::Ref<embree::XML>,_std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                    *)&(xml[10].ptr)->name,&local_d8);
    if (iVar8._M_node == (_Base_ptr)&((xml[10].ptr)->name)._M_string_length) {
      this_01 = (XMLLoader *)*in_RDX;
      local_70._0_8_ = (_Base_ptr)(local_70 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"code","");
      XML::child((XML *)&local_d0,(string *)this_01);
      load<std::__cxx11::string>((string *)&local_c8.field_1,this_01,(Ref<embree::XML> *)&local_d0);
      std::__cxx11::string::string((string *)&local_50,(char *)local_c8._0_8_,&local_d9);
      if ((char *)local_c8._0_8_ != local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
      if ((long *)local_d0._M_i != (long *)0x0) {
        (**(code **)(*(long *)local_d0._M_i + 0x18))();
      }
      if ((_Base_ptr)local_70._0_8_ != (_Base_ptr)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
      psVar11 = (string *)xml;
      loadMaterialParms((Parms *)&local_c8.field_1,(XMLLoader *)xml,&local_d8);
      addMaterial((XMLLoader *)local_70,psVar11,(Parms *)&local_50);
      pmVar9 = std::
               map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)&(xml[10].ptr)->name,&local_d8);
      uVar3 = local_70._0_8_;
      if ((_Base_ptr)local_70._0_8_ != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_70._0_8_ + 0x10))(local_70._0_8_);
      }
      if (pmVar9->ptr != (MaterialNode *)0x0) {
        (*(pmVar9->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pmVar9->ptr = (MaterialNode *)uVar3;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)xml[10].ptr,(key_type *)&local_90);
      if ((_Base_ptr)uVar3 != (_Base_ptr)0x0) {
        (**(code **)(*(long *)uVar3 + 0x10))(uVar3);
      }
      if (pmVar7->ptr != (MaterialNode *)0x0) {
        (*(pmVar7->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pmVar7->ptr = (MaterialNode *)uVar3;
      (this->path).filename._M_dataplus._M_p = (pointer)uVar3;
      if ((_Base_ptr)uVar3 != (_Base_ptr)0x0) {
        (**(code **)(*(long *)uVar3 + 0x10))(uVar3);
        if ((_Base_ptr)uVar3 != (_Base_ptr)0x0) {
          (**(code **)(*(long *)uVar3 + 0x18))(uVar3);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
                   *)&local_c8.field_1);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
    }
    else {
      pmVar9 = std::
               map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)&(xml[10].ptr)->name,&local_d8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)xml[10].ptr,(key_type *)&local_90);
      if (pmVar9->ptr != (MaterialNode *)0x0) {
        (*(pmVar9->ptr->super_Node).super_RefCount._vptr_RefCount[2])();
      }
      if (pmVar7->ptr != (MaterialNode *)0x0) {
        (*(pmVar7->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pMVar2 = pmVar9->ptr;
      pmVar7->ptr = pMVar2;
      (this->path).filename._M_dataplus._M_p = (pointer)pMVar2;
      if (pMVar2 != (MaterialNode *)0x0) {
        (**(code **)((long)(pMVar2->super_Node).super_RefCount._vptr_RefCount + 0x10))();
      }
    }
    if (local_d8.ptr != (XML *)0x0) {
      (*((local_d8.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Warning: material ",0x12);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_90._0_8_,local_90._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," is not defined",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    this_00 = (MatteMaterial *)alignedUSMMalloc(0x90,0x10,DEVICE_READ_ONLY);
    local_c8._0_8_ = (char *)0x3f000000;
    local_c8._8_8_ = 0;
    MatteMaterial::MatteMaterial(this_00,(Vec3fa *)&local_c8.field_1);
    (this->path).filename._M_dataplus._M_p = (pointer)this_00;
    (**(code **)(*(long *)&(this_00->super_MaterialNode).super_Node.super_RefCount + 0x10))(this_00)
    ;
  }
LAB_001817cf:
  if ((char *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_);
  }
  return (Ref<embree::SceneGraph::MaterialNode>)(MaterialNode *)this;
}

Assistant:

Ref<SceneGraph::MaterialNode> XMLLoader::loadMaterial(const Ref<XML>& xml) 
  {
    const std::string id = xml->parm("id");
    if (id != "" && state.materialMap.find(id) != state.materialMap.end())
      return state.materialMap[id];

    if (!xml->hasChild("parameters")) {
      std::cout << "Warning: material " << id << " is not defined" << std::endl;
      return new MatteMaterial(Vec3fa(0.5f,0.0f,0.0f));
    }
    Ref<XML> parameters = xml->child("parameters");
    if (state.materialCache.find(parameters) != state.materialCache.end()) {
      return state.materialMap[id] = state.materialCache[parameters];
    }

    std::string type = load<std::string>(xml->child("code")).c_str();
    Parms parms = loadMaterialParms(parameters);
    Ref<SceneGraph::MaterialNode> material = addMaterial(type,parms);
    state.materialCache[parameters] = material;
    return state.materialMap[id] = material;
  }